

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlrole.c
# Opt level: O3

int condSect0(PROLOG_STATE *state,int tok,char *ptr,char *end,ENCODING *enc)

{
  int iVar1;
  code *pcVar2;
  int iVar3;
  
  if (tok == 0xf) {
    return 0;
  }
  if (tok == 0x12) {
    iVar1 = (*enc->nameMatchesAscii)(enc,ptr,end,"INCLUDE");
    iVar3 = 0;
    if (iVar1 != 0) {
      pcVar2 = condSect1;
      iVar3 = 0;
      goto LAB_0015f9c3;
    }
    iVar1 = (*enc->nameMatchesAscii)(enc,ptr,end,"IGNORE");
    if (iVar1 != 0) {
      pcVar2 = condSect2;
      goto LAB_0015f9c3;
    }
  }
  else if ((tok == 0x1c) && (state->documentEntity == 0)) {
    return 0x34;
  }
  iVar3 = -1;
  pcVar2 = error;
LAB_0015f9c3:
  state->handler = pcVar2;
  return iVar3;
}

Assistant:

static
int condSect0(PROLOG_STATE *state,
              int tok,
              const char *ptr,
              const char *end,
              const ENCODING *enc)
{
  cmExpatUnused(ptr);
  cmExpatUnused(end);
  cmExpatUnused(enc);
  switch (tok) {
  case XML_TOK_PROLOG_S:
    return XML_ROLE_NONE;
  case XML_TOK_NAME:
    if (XmlNameMatchesAscii(enc, ptr, end, KW_INCLUDE)) {
      state->handler = condSect1;
      return XML_ROLE_NONE;
    }
    if (XmlNameMatchesAscii(enc, ptr, end, KW_IGNORE)) {
      state->handler = condSect2;
      return XML_ROLE_NONE;
    }
    break;
  }
  return common(state, tok);
}